

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_bin_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  _Alloc_hider _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  size_t __n;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  long lVar6;
  basic_value<toml::type_config> *ctx_00;
  size_type sVar7;
  char *pcVar8;
  string str;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  region reg;
  result<long,_toml::error_info> val;
  location first;
  string local_5b8;
  char *local_598;
  undefined2 local_590;
  undefined6 uStack_58e;
  size_t sStack_588;
  char *pcStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_578;
  size_type local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_568;
  string local_558;
  string local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  integer_format_info local_4f8;
  region local_4b8;
  undefined1 local_448 [8];
  anon_union_88_2_fd5fb55d_for_result<long,_toml::error_info>_3 local_440;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c8;
  undefined8 local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_338;
  location local_320;
  region_type local_2d8;
  location local_268;
  source_location local_220;
  failure<toml::error_info> local_1a8;
  basic_value<toml::type_config> local_150;
  failure<toml::error_info> local_88;
  
  location::location(&local_320,loc);
  syntax::bin_int((sequence *)local_3e8,&ctx->toml_spec_);
  sequence::scan(&local_4b8,(sequence *)local_3e8,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_3e8 + 8));
  if (local_4b8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_538,
               "toml::parse_bin_integer: invalid integer: bin_int must be like: 0b0101, 0b1111_0000"
               ,"");
    syntax::bin_int((sequence *)local_448,&ctx->toml_spec_);
    location::location(&local_268,loc);
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_3e8,&local_538,(sequence *)local_448,&local_268,&local_558);
    err<toml::error_info>(&local_88,(error_info *)local_3e8);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0 != local_3a0) {
      operator_delete((void *)local_3b0,local_3a0[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_3c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._0_8_ != &local_3d8) {
      operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_268);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&local_440.succ_);
    local_5b8._M_dataplus._M_p = local_538._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_538._M_dataplus._M_p == &local_538.field_2) goto LAB_003843b3;
  }
  else {
    puVar3 = ((local_4b8.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_5b8,(detail *)(puVar3 + local_4b8.first_),
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(puVar3 + local_4b8.last_),in_RCX);
    pcStack_580 = (char *)0x0;
    local_570 = 0;
    local_568._M_local_buf[0] = '\0';
    local_590 = 0x101;
    local_3e8._0_8_ = local_5b8._M_dataplus._M_p + local_5b8._M_string_length;
    if (local_5b8._M_string_length == 0) {
      lVar6 = 0;
    }
    else {
      sVar7 = 0;
      lVar6 = 0;
      do {
        lVar6 = lVar6 + (ulong)(local_5b8._M_dataplus._M_p[sVar7] == '_');
        sVar7 = sVar7 + 1;
      } while (local_5b8._M_string_length != sVar7);
    }
    sStack_588 = (local_5b8._M_string_length - lVar6) - 2;
    local_448 = (undefined1  [8])local_5b8._M_dataplus._M_p;
    local_578 = &local_568;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
              (&local_598);
    _Var4._M_p = local_5b8._M_dataplus._M_p;
    if (local_598 != local_5b8._M_dataplus._M_p) {
      pcStack_580 = local_5b8._M_dataplus._M_p + (local_5b8._M_string_length - (long)local_598);
    }
    local_3e8[0] = 0x31;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_5b8._M_dataplus._M_p + 2,
                       local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
    sVar7 = (long)_Var4._M_p - (long)local_5b8._M_dataplus._M_p;
    if (local_5b8._M_dataplus._M_p + local_5b8._M_string_length == _Var5._M_current) {
      pcVar8 = local_5b8._M_dataplus._M_p + sVar7;
      local_5b8._M_string_length = sVar7;
    }
    else {
      lVar6 = (long)_Var5._M_current - (long)_Var4._M_p;
      if ((local_5b8._M_string_length != sVar7 + lVar6 && lVar6 != 0) &&
         (__n = local_5b8._M_string_length - (sVar7 + lVar6), __n != 0)) {
        pcVar8 = local_5b8._M_dataplus._M_p + sVar7;
        if (__n == 1) {
          *pcVar8 = pcVar8[lVar6];
        }
        else {
          memmove(pcVar8,pcVar8 + lVar6,__n);
        }
      }
      pcVar8 = local_5b8._M_dataplus._M_p + (local_5b8._M_string_length - lVar6);
      local_5b8._M_string_length = local_5b8._M_string_length - lVar6;
    }
    *pcVar8 = '\0';
    local_3e8[0] = 0x5f;
    _Var5 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_5b8._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_5b8._M_dataplus._M_p + local_5b8._M_string_length),
                       (_Iter_equals_val<const_char>)local_3e8);
    local_5b8._M_string_length = (long)_Var5._M_current - (long)local_5b8._M_dataplus._M_p;
    *_Var5._M_current = '\0';
    if (local_5b8._M_string_length == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b8,0,0
                 ,"0",1);
    }
    region::region((region *)local_3e8,loc);
    source_location::source_location(&local_220,(region *)local_3e8);
    type_config::parse_int((result<long,_toml::error_info> *)local_448,&local_5b8,&local_220,'\x02')
    ;
    source_location::~source_location(&local_220);
    region::~region((region *)local_3e8);
    if (local_448[0] == true) {
      local_4f8._2_6_ = uStack_58e;
      local_4f8._0_2_ = local_590;
      paVar1 = &local_4f8.suffix.field_2;
      local_4f8.width = sStack_588;
      local_4f8.spacer = (size_t)pcStack_580;
      if (local_578 == &local_568) {
        local_4f8.suffix.field_2._8_8_ = local_568._8_8_;
        local_4f8.suffix._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_4f8.suffix._M_dataplus._M_p = (pointer)local_578;
      }
      local_4f8.suffix.field_2._M_allocated_capacity._1_7_ = local_568._M_allocated_capacity._1_7_;
      local_4f8.suffix.field_2._M_local_buf[0] = local_568._M_local_buf[0];
      local_4f8.suffix._M_string_length = local_570;
      local_570 = 0;
      local_568._M_local_buf[0] = '\0';
      local_518.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_518.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_518.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar2 = &local_4b8.source_name_.field_2;
      local_2d8.source_name_._M_dataplus._M_p = (pointer)&local_2d8.source_name_.field_2;
      local_2d8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_4b8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_2d8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_4b8.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      local_4b8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_4b8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8.source_name_._M_dataplus._M_p == paVar2) {
        local_2d8.source_name_.field_2._8_8_ = local_4b8.source_name_.field_2._8_8_;
      }
      else {
        local_2d8.source_name_._M_dataplus._M_p = local_4b8.source_name_._M_dataplus._M_p;
      }
      local_2d8.source_name_._M_string_length = local_4b8.source_name_._M_string_length;
      local_4b8.source_name_._M_string_length = 0;
      local_4b8.source_name_.field_2._M_local_buf[0] = '\0';
      local_2d8.length_ = local_4b8.length_;
      local_2d8.first_ = local_4b8.first_;
      local_2d8.first_line_ = local_4b8.first_line_;
      local_2d8.first_column_ = local_4b8.first_column_;
      local_2d8.last_ = local_4b8.last_;
      local_2d8.last_line_ = local_4b8.last_line_;
      local_2d8.last_column_ = local_4b8.last_column_;
      local_578 = &local_568;
      local_4b8.source_name_._M_dataplus._M_p = (pointer)paVar2;
      basic_value<toml::type_config>::basic_value
                ((basic_value<toml::type_config> *)local_3e8,(integer_type)local_440.succ_.value,
                 &local_4f8,&local_518,&local_2d8);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_150,(toml *)local_3e8,v_00
                );
      __return_storage_ptr__->is_ok_ = true;
      ctx_00 = &local_150;
      basic_value<toml::type_config>::basic_value
                (&(__return_storage_ptr__->field_1).succ_.value,&local_150);
      basic_value<toml::type_config>::cleanup(&local_150,(EVP_PKEY_CTX *)ctx_00);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_150.comments_);
      region::~region(&local_150.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_3e8,(EVP_PKEY_CTX *)ctx_00);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_338);
      region::~region((region *)local_3a0);
      region::~region(&local_2d8);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8.suffix._M_dataplus._M_p != paVar1) {
        operator_delete(local_4f8.suffix._M_dataplus._M_p,
                        local_4f8.suffix.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      (loc->source_).
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_320.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 &local_320.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&loc->source_name_,&local_320.source_name_);
      loc->column_number_ = local_320.column_number_;
      loc->location_ = local_320.location_;
      loc->line_number_ = local_320.line_number_;
      err<toml::error_info_const&>(&local_1a8,(toml *)&local_440.succ_,v);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_1a8);
      failure<toml::error_info>::~failure(&local_1a8);
    }
    if (local_448[0] == false) {
      failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_440.succ_);
    }
    if (local_578 != &local_568) {
      operator_delete(local_578,
                      CONCAT71(local_568._M_allocated_capacity._1_7_,local_568._M_local_buf[0]) + 1)
      ;
    }
    local_538.field_2._M_allocated_capacity = local_5b8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p == &local_5b8.field_2) goto LAB_003843b3;
  }
  operator_delete(local_5b8._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
LAB_003843b3:
  region::~region(&local_4b8);
  location::~location(&local_320);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_bin_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();
    auto reg = syntax::bin_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_bin_integer: "
            "invalid integer: bin_int must be like: 0b0101, 0b1111_0000",
            syntax::bin_int(spec), loc));
    }

    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt   = integer_format::bin;
    fmt.width = str.size() - 2 - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // skip prefix `0b` and zeros and underscores at the MSB
    str.erase(str.begin(), std::find(std::next(str.begin(), 2), str.end(), '1'));

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    // 0b0000_0000 becomes empty.
    if(str.empty()) { str = "0"; }

    const auto val = TC::parse_int(str, source_location(region(loc)), 2);
    if(val.is_ok())
    {
        return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
    }
    else
    {
        loc = first;
        return err(val.as_err());
    }
}